

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.h
# Opt level: O2

CBoundary * __thiscall CLayer::GetBoundary(CLayer *this,int iX1,int iY1,int iX2,int iY2)

{
  int iVar1;
  CBoundary *pCVar2;
  int iVar3;
  
  if (iY1 == iY2 && iX1 == iX2) {
    return (CBoundary *)0x0;
  }
  iVar1 = IsHorizontal(this);
  iVar3 = iX1;
  if ((iY1 - iY2 == 0) && (iVar1 != 0)) {
    if (((iX1 - iX2) + 1U & 0xfffffffd) != 0) {
      __assert_fail("abs(iX1-iX2)==1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Layer.h"
                    ,0xaf,"CBoundary *CLayer::GetBoundary(int, int, int, int)");
    }
    iY2 = iY1;
    iVar3 = iX2;
    if (iX1 < iX2) {
      iVar3 = iX1;
    }
  }
  else {
    iVar1 = IsVertical(this);
    if (iX1 != iX2) {
      return (CBoundary *)0x0;
    }
    if (iVar1 == 0) {
      return (CBoundary *)0x0;
    }
    if (((iY1 - iY2) + 1U & 0xfffffffd) != 0) {
      __assert_fail("abs(iY1-iY2)==1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Layer.h"
                    ,0xb4,"CBoundary *CLayer::GetBoundary(int, int, int, int)");
    }
    if (iY1 < iY2) {
      iY2 = iY1;
    }
  }
  pCVar2 = GetBoundary(this,iVar3,iY2);
  return pCVar2;
}

Assistant:

inline CBoundary* CLayer::GetBoundary(int iX1, int iY1, int iX2, int iY2)
{
	if(iX1==iX2&&iY1==iY2)	return	NULL;

	if(IsHorizontal()&&iY1==iY2)
	{
		assert(abs(iX1-iX2)==1);
		return	GetBoundary(MIN(iX1,iX2),iY1);
	}
	else if(IsVertical()&&iX1==iX2)
	{
		assert(abs(iY1-iY2)==1);
		return	GetBoundary(iX1,MIN(iY1,iY2));
	}

	return	NULL;
}